

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CrossLinkField
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto)

{
  uint uVar1;
  int number;
  bool bVar2;
  CppType CVar3;
  Type TVar4;
  FieldOptions *pFVar5;
  FieldDescriptor *pFVar6;
  ExtensionRange *pEVar7;
  DescriptorPool *pDVar8;
  GoogleOnceDynamic *pGVar9;
  string *psVar10;
  EnumDescriptor *pEVar11;
  EnumDescriptor *pEVar12;
  PlaceholderType placeholder_type;
  anon_union_8_8_13f84498_for_Symbol_2 aVar13;
  SubstituteArg *this_00;
  char *error;
  Symbol SVar14;
  ErrorLocation location;
  undefined4 uVar15;
  string name;
  string error_msg;
  SubstituteArg local_208;
  string *local_1d8;
  string local_1d0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  SubstituteArg local_120;
  SubstituteArg local_f0;
  SubstituteArg local_c0;
  SubstituteArg local_90;
  SubstituteArg local_60;
  
  if (*(long *)(field + 0x80) == 0) {
    pFVar5 = FieldOptions::default_instance();
    *(FieldOptions **)(field + 0x80) = pFVar5;
  }
  FileDescriptorTables::AddFieldByStylizedNames(this->file_tables_,field);
  if (((proto->_has_bits_).has_bits_[0] & 2) == 0) {
LAB_002e99b1:
    if ((*(long *)(field + 0x60) != 0) && (*(int *)(field + 0x4c) != 1)) {
      AddError(this,*(string **)(field + 8),&proto->super_Message,NAME,
               "Fields of oneofs must themselves have label LABEL_OPTIONAL.");
    }
    uVar1 = (proto->_has_bits_).has_bits_[0];
    if ((uVar1 & 4) == 0) {
      CVar3 = FieldDescriptor::cpp_type(field);
      if ((CVar3 == CPPTYPE_MESSAGE) ||
         (CVar3 = FieldDescriptor::cpp_type(field), CVar3 == CPPTYPE_ENUM)) {
        psVar10 = *(string **)(field + 8);
        error = "Field with message or enum type missing type_name.";
LAB_002e9a09:
        location = TYPE;
LAB_002e9a0b:
        AddError(this,psVar10,&proto->super_Message,location,error);
      }
LAB_002e9a17:
      bVar2 = FileDescriptorTables::AddFieldByNumber(this->file_tables_,field);
      if (bVar2) {
        if (field[0x50] != (FieldDescriptor)0x1) {
          return;
        }
        bVar2 = DescriptorPool::Tables::AddExtension(this->tables_,field);
        if (bVar2) {
          return;
        }
        pFVar6 = DescriptorPool::Tables::FindExtension
                           (this->tables_,*(Descriptor **)(field + 0x58),*(int *)(field + 0x38));
        strings::internal::SubstituteArg::SubstituteArg
                  ((SubstituteArg *)&name,*(int *)(field + 0x38));
        local_208.text_ = (char *)**(undefined8 **)(*(long *)(field + 0x58) + 8);
        local_208.size_ = *(int *)(*(undefined8 **)(*(long *)(field + 0x58) + 8) + 1);
        local_1b0.text_ = (char *)**(undefined8 **)(pFVar6 + 8);
        local_1b0.size_ = *(int *)(*(undefined8 **)(pFVar6 + 8) + 1);
        local_180.text_ = *(char **)**(long **)(pFVar6 + 0x30);
        local_180.size_ = *(int *)((undefined8 *)**(long **)(pFVar6 + 0x30) + 1);
        local_60.text_ = (char *)0x0;
        local_60.size_ = -1;
        local_90.text_ = (char *)0x0;
        local_90.size_ = -1;
        local_c0.text_ = (char *)0x0;
        local_c0.size_ = -1;
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&error_msg,
                   (strings *)
                   "Extension number $0 has already been used in \"$1\" by extension \"$2\" defined in $3."
                   ,(char *)&name,&local_208,&local_1b0,&local_180,&local_60,&local_90,&local_c0,
                   &local_f0,&local_120,&local_150,(SubstituteArg *)name._M_dataplus._M_p);
        AddWarning(this,*(string **)(field + 8),&proto->super_Message,NUMBER,&error_msg);
      }
      else {
        pFVar6 = FileDescriptorTables::FindFieldByNumber
                           (this->file_tables_,*(Descriptor **)(field + 0x58),*(int *)(field + 0x38)
                           );
        if (*(long *)(field + 0x58) == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&error_msg,"unknown",(allocator<char> *)&name);
        }
        else {
          std::__cxx11::string::string
                    ((string *)&error_msg,*(string **)(*(long *)(field + 0x58) + 8));
        }
        psVar10 = *(string **)(field + 8);
        if (field[0x50] == (FieldDescriptor)0x1) {
          strings::internal::SubstituteArg::SubstituteArg
                    ((SubstituteArg *)&name,*(int *)(field + 0x38));
          local_208.text_ = error_msg._M_dataplus._M_p;
          local_208.size_ = (int)error_msg._M_string_length;
          local_1b0.text_ = (char *)**(undefined8 **)(pFVar6 + 8);
          local_1b0.size_ = *(int *)(*(undefined8 **)(pFVar6 + 8) + 1);
          local_180.text_ = (char *)0x0;
          local_180.size_ = -1;
          local_60.text_ = (char *)0x0;
          local_60.size_ = -1;
          local_90.text_ = (char *)0x0;
          local_90.size_ = -1;
          local_c0.text_ = (char *)0x0;
          local_c0.size_ = -1;
          local_f0.text_ = (char *)0x0;
          local_f0.size_ = -1;
          local_120.text_ = (char *)0x0;
          local_120.size_ = -1;
          local_150.text_ = (char *)0x0;
          local_150.size_ = -1;
          strings::Substitute_abi_cxx11_
                    (&local_1d0,
                     (strings *)
                     "Extension number $0 has already been used in \"$1\" by extension \"$2\".",
                     (char *)&name,&local_208,&local_1b0,&local_180,&local_60,&local_90,&local_c0,
                     &local_f0,&local_120,&local_150,(SubstituteArg *)name._M_dataplus._M_p);
          AddError(this,psVar10,&proto->super_Message,NUMBER,&local_1d0);
        }
        else {
          strings::internal::SubstituteArg::SubstituteArg
                    ((SubstituteArg *)&name,*(int *)(field + 0x38));
          local_208.text_ = error_msg._M_dataplus._M_p;
          local_208.size_ = (int)error_msg._M_string_length;
          local_1b0.text_ = (char *)**(undefined8 **)pFVar6;
          local_1b0.size_ = *(int *)(*(undefined8 **)pFVar6 + 1);
          local_180.text_ = (char *)0x0;
          local_180.size_ = -1;
          local_60.text_ = (char *)0x0;
          local_60.size_ = -1;
          local_90.text_ = (char *)0x0;
          local_90.size_ = -1;
          local_c0.text_ = (char *)0x0;
          local_c0.size_ = -1;
          local_f0.text_ = (char *)0x0;
          local_f0.size_ = -1;
          local_120.text_ = (char *)0x0;
          local_120.size_ = -1;
          local_150.text_ = (char *)0x0;
          local_150.size_ = -1;
          strings::Substitute_abi_cxx11_
                    (&local_1d0,
                     (strings *)"Field number $0 has already been used in \"$1\" by field \"$2\".",
                     (char *)&name,&local_208,&local_1b0,&local_180,&local_60,&local_90,&local_c0,
                     &local_f0,&local_120,&local_150,(SubstituteArg *)name._M_dataplus._M_p);
          AddError(this,psVar10,&proto->super_Message,NUMBER,&local_1d0);
        }
        std::__cxx11::string::~string((string *)&local_1d0);
      }
      this_00 = (SubstituteArg *)&error_msg;
      goto LAB_002ea246;
    }
    placeholder_type = uVar1 >> 3 & PLACEHOLDER_ENUM;
    if (proto->type_ == 0xe) {
      placeholder_type = PLACEHOLDER_ENUM;
    }
    SVar14 = LookupSymbol(this,(proto->type_name_).ptr_,*(string **)(field + 8),placeholder_type,
                          LOOKUP_TYPES,(bool)(this->pool_->lazily_build_dependencies_ ^ 1));
    aVar13 = SVar14.field_1;
    TVar4 = SVar14.type;
    if (TVar4 == NULL_SYMBOL) {
      pDVar8 = this->pool_;
      if (pDVar8->enforce_weak_ == false) {
        pFVar5 = proto->options_;
        if (pFVar5 == (FieldOptions *)0x0) {
          pFVar5 = (FieldOptions *)&_FieldOptions_default_instance_;
        }
        if (pFVar5->weak_ == true) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&name,"google.protobuf.Empty",(allocator<char> *)&local_208);
          SVar14 = FindSymbol(this,&name,true);
          aVar13 = SVar14.field_1;
          TVar4 = SVar14.type;
          std::__cxx11::string::~string((string *)&name);
          if (TVar4 != NULL_SYMBOL) goto LAB_002e9bec;
          pDVar8 = this->pool_;
        }
      }
      if (pDVar8->lazily_build_dependencies_ != true) {
        AddNotDefinedError(this,*(string **)(field + 8),&proto->super_Message,TYPE,
                           (proto->type_name_).ptr_);
        return;
      }
      std::__cxx11::string::string((string *)&name,(string *)(proto->type_name_).ptr_);
      if (this->pool_->enforce_weak_ == false) {
        pFVar5 = proto->options_;
        if (pFVar5 == (FieldOptions *)0x0) {
          pFVar5 = (FieldOptions *)&_FieldOptions_default_instance_;
        }
        if (pFVar5->weak_ == true) {
          std::__cxx11::string::assign((char *)&name);
        }
      }
      pGVar9 = DescriptorPool::Tables::AllocateOnceDynamic(this->tables_);
      *(GoogleOnceDynamic **)(field + 0x40) = pGVar9;
      psVar10 = DescriptorPool::Tables::AllocateString(this->tables_,&name);
      *(string **)(field + 0x88) = psVar10;
      if (((proto->_has_bits_).has_bits_[0] & 8) != 0) {
        psVar10 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->default_value_).ptr_)
        ;
        *(string **)(field + 0x90) = psVar10;
      }
      FileDescriptorTables::AddFieldByNumber(this->file_tables_,field);
      this_00 = (SubstituteArg *)&name;
      if (field[0x50] == (FieldDescriptor)0x1) {
        DescriptorPool::Tables::AddExtension(this->tables_,field);
        this_00 = (SubstituteArg *)&name;
      }
      goto LAB_002ea246;
    }
LAB_002e9bec:
    if (((proto->_has_bits_).has_bits_[0] & 0x200) == 0) {
      if (TVar4 == MESSAGE) {
        uVar15 = 0xb;
      }
      else {
        if (TVar4 != ENUM) {
          psVar10 = *(string **)(field + 8);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_208,"\"",(proto->type_name_).ptr_);
          std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &local_208,"\" is not a type.");
          AddError(this,psVar10,&proto->super_Message,TYPE,&name);
          goto LAB_002ea239;
        }
        uVar15 = 0xe;
      }
      *(undefined4 *)(field + 0x48) = uVar15;
    }
    CVar3 = FieldDescriptor::cpp_type(field);
    if (CVar3 == CPPTYPE_MESSAGE) {
      if (TVar4 == MESSAGE) {
        *(anon_union_8_8_13f84498_for_Symbol_2 *)(field + 0x70) = aVar13;
        if (field[0x98] != (FieldDescriptor)0x1) goto LAB_002e9a17;
        psVar10 = *(string **)(field + 8);
        error = "Messages can\'t have default values.";
LAB_002ea11c:
        location = DEFAULT_VALUE;
        goto LAB_002e9a0b;
      }
      psVar10 = *(string **)(field + 8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208
                     ,"\"",(proto->type_name_).ptr_);
      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_208,"\" is not a message type.");
      AddError(this,psVar10,&proto->super_Message,TYPE,&name);
    }
    else {
      CVar3 = FieldDescriptor::cpp_type(field);
      if (CVar3 != CPPTYPE_ENUM) {
        psVar10 = *(string **)(field + 8);
        error = "Field with primitive type has type_name.";
        goto LAB_002e9a09;
      }
      if (TVar4 == ENUM) {
        *(anon_union_8_8_13f84498_for_Symbol_2 *)(field + 0x78) = aVar13;
        pEVar11 = FieldDescriptor::enum_type(field);
        if (pEVar11[0x28] == (EnumDescriptor)0x1) {
          field[0x98] = (FieldDescriptor)0x0;
        }
        else if (((byte)field[0x98] & 1) != 0) {
          bVar2 = io::Tokenizer::IsIdentifier((proto->default_value_).ptr_);
          if (!bVar2) {
            psVar10 = *(string **)(field + 8);
            error = "Default value for an enum field must be an identifier.";
            goto LAB_002ea11c;
          }
          psVar10 = (proto->default_value_).ptr_;
          pEVar11 = FieldDescriptor::enum_type(field);
          SVar14 = LookupSymbolNoPlaceholder(this,psVar10,*(string **)(pEVar11 + 8),LOOKUP_ALL,true)
          ;
          if ((SVar14.type == ENUM_VALUE) &&
             (pEVar11 = *(EnumDescriptor **)(SVar14.field_1.descriptor + 0x18),
             pEVar12 = FieldDescriptor::enum_type(field), pEVar11 == pEVar12)) {
            ((anon_union_8_8_13f84498_for_Symbol_2 *)(field + 0xa0))->descriptor =
                 (Descriptor *)SVar14.field_1;
          }
          else {
            psVar10 = *(string **)(field + 8);
            pEVar11 = FieldDescriptor::enum_type(field);
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_180,"Enum type \"",
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            (pEVar11 + 8));
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1b0,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_180,"\" has no value named \"");
            std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_208,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_1b0,(proto->default_value_).ptr_);
            std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                  *)&local_208,"\".");
            AddError(this,psVar10,&proto->super_Message,DEFAULT_VALUE,&name);
            std::__cxx11::string::~string((string *)&name);
            std::__cxx11::string::~string((string *)&local_208);
            std::__cxx11::string::~string((string *)&local_1b0);
            std::__cxx11::string::~string((string *)&local_180);
          }
          goto LAB_002e9a17;
        }
        pEVar11 = FieldDescriptor::enum_type(field);
        if (0 < *(int *)(pEVar11 + 0x2c)) {
          pEVar11 = FieldDescriptor::enum_type(field);
          *(undefined8 *)(field + 0xa0) = *(undefined8 *)(pEVar11 + 0x30);
        }
        goto LAB_002e9a17;
      }
      psVar10 = *(string **)(field + 8);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208
                     ,"\"",(proto->type_name_).ptr_);
      std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &local_208,"\" is not an enum type.");
      AddError(this,psVar10,&proto->super_Message,TYPE,&name);
    }
  }
  else {
    SVar14 = LookupSymbol(this,(proto->extendee_).ptr_,*(string **)(field + 8),
                          PLACEHOLDER_EXTENDABLE_MESSAGE,LOOKUP_ALL,true);
    aVar13 = SVar14.field_1;
    if (SVar14.type == MESSAGE) {
      ((anon_union_8_8_13f84498_for_Symbol_2 *)(field + 0x58))->descriptor = (Descriptor *)aVar13;
      number = *(int *)(field + 0x38);
      pEVar7 = Descriptor::FindExtensionRangeContainingNumber(aVar13.descriptor,number);
      if (pEVar7 == (ExtensionRange *)0x0) {
        local_1d8 = *(string **)(field + 8);
        name._M_dataplus._M_p = (pointer)**(undefined8 **)(aVar13.descriptor + 8);
        name._M_string_length._0_4_ = *(undefined4 *)(*(undefined8 **)(aVar13.descriptor + 8) + 1);
        strings::internal::SubstituteArg::SubstituteArg(&local_208,number);
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        local_60.text_ = (char *)0x0;
        local_60.size_ = -1;
        local_90.text_ = (char *)0x0;
        local_90.size_ = -1;
        local_c0.text_ = (char *)0x0;
        local_c0.size_ = -1;
        local_f0.text_ = (char *)0x0;
        local_f0.size_ = -1;
        local_120.text_ = (char *)0x0;
        local_120.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        strings::Substitute_abi_cxx11_
                  (&error_msg,(strings *)"\"$0\" does not declare $1 as an extension number.",
                   (char *)&name,&local_208,&local_1b0,&local_180,&local_60,&local_90,&local_c0,
                   &local_f0,&local_120,&local_150,(SubstituteArg *)name._M_dataplus._M_p);
        AddError(this,local_1d8,&proto->super_Message,NUMBER,&error_msg);
        std::__cxx11::string::~string((string *)&error_msg);
      }
      goto LAB_002e99b1;
    }
    if (SVar14.type == NULL_SYMBOL) {
      AddNotDefinedError(this,*(string **)(field + 8),&proto->super_Message,EXTENDEE,
                         (proto->extendee_).ptr_);
      return;
    }
    psVar10 = *(string **)(field + 8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_208,
                   "\"",(proto->extendee_).ptr_);
    std::operator+(&name,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_208,"\" is not a message type.");
    AddError(this,psVar10,&proto->super_Message,EXTENDEE,&name);
  }
LAB_002ea239:
  std::__cxx11::string::~string((string *)&name);
  this_00 = &local_208;
LAB_002ea246:
  std::__cxx11::string::~string((string *)this_00);
  return;
}

Assistant:

void DescriptorBuilder::CrossLinkField(
    FieldDescriptor* field, const FieldDescriptorProto& proto) {
  if (field->options_ == NULL) {
    field->options_ = &FieldOptions::default_instance();
  }

  // Add the field to the lowercase-name and camelcase-name tables.
  file_tables_->AddFieldByStylizedNames(field);

  if (proto.has_extendee()) {
    Symbol extendee =
        LookupSymbol(proto.extendee(), field->full_name(),
                     DescriptorPool::PLACEHOLDER_EXTENDABLE_MESSAGE);
    if (extendee.IsNull()) {
      AddNotDefinedError(field->full_name(), proto,
                         DescriptorPool::ErrorCollector::EXTENDEE,
                         proto.extendee());
      return;
    } else if (extendee.type != Symbol::MESSAGE) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE,
               "\"" + proto.extendee() + "\" is not a message type.");
      return;
    }
    field->containing_type_ = extendee.descriptor;

    const Descriptor::ExtensionRange* extension_range = field->containing_type()
        ->FindExtensionRangeContainingNumber(field->number());

    if (extension_range == NULL) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("\"$0\" does not declare $1 as an "
                                   "extension number.",
                                   field->containing_type()->full_name(),
                                   field->number()));
    }
  }

  if (field->containing_oneof() != NULL) {
    if (field->label() != FieldDescriptor::LABEL_OPTIONAL) {
      // Note that this error will never happen when parsing .proto files.
      // It can only happen if you manually construct a FileDescriptorProto
      // that is incorrect.
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NAME,
               "Fields of oneofs must themselves have label LABEL_OPTIONAL.");
    }
  }

  if (proto.has_type_name()) {
    // Assume we are expecting a message type unless the proto contains some
    // evidence that it expects an enum type.  This only makes a difference if
    // we end up creating a placeholder.
    bool expecting_enum = (proto.type() == FieldDescriptorProto::TYPE_ENUM) ||
                          proto.has_default_value();

    Symbol type =
        LookupSymbol(proto.type_name(), field->full_name(),
                     expecting_enum ? DescriptorPool::PLACEHOLDER_ENUM
                                    : DescriptorPool::PLACEHOLDER_MESSAGE,
                     LOOKUP_TYPES, !pool_->lazily_build_dependencies_);

    // If the type is a weak type, we change the type to a google.protobuf.Empty field.
    if (type.IsNull() && !pool_->enforce_weak_ && proto.options().weak()) {
      type = FindSymbol(kNonLinkedWeakMessageReplacementName);
    }

    if (type.IsNull()) {
      if (pool_->lazily_build_dependencies_) {
        // Save the symbol names for later for lookup, and allocate the once
        // object needed for the accessors.
        string name = proto.type_name();
        if (!pool_->enforce_weak_ && proto.options().weak()) {
          name = kNonLinkedWeakMessageReplacementName;
        }
        field->type_once_ = tables_->AllocateOnceDynamic();
        field->type_name_ = tables_->AllocateString(name);
        if (proto.has_default_value()) {
          field->default_value_enum_name_ =
              tables_->AllocateString(proto.default_value());
        }
        // AddFieldByNumber and AddExtension are done later in this function,
        // and can/must be done if the field type was not found. The related
        // error checking is not necessary when in lazily_build_dependencies_
        // mode, and can't be done without building the type's descriptor,
        // which we don't want to do.
        file_tables_->AddFieldByNumber(field);
        if (field->is_extension()) {
          tables_->AddExtension(field);
        }
        return;
      } else {
        AddNotDefinedError(field->full_name(), proto,
                           DescriptorPool::ErrorCollector::TYPE,
                           proto.type_name());
        return;
      }
    }

    if (!proto.has_type()) {
      // Choose field type based on symbol.
      if (type.type == Symbol::MESSAGE) {
        field->type_ = FieldDescriptor::TYPE_MESSAGE;
      } else if (type.type == Symbol::ENUM) {
        field->type_ = FieldDescriptor::TYPE_ENUM;
      } else {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not a type.");
        return;
      }
    }

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      if (type.type != Symbol::MESSAGE) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not a message type.");
        return;
      }
      field->message_type_ = type.descriptor;

      if (field->has_default_value()) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                 "Messages can't have default values.");
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      if (type.type != Symbol::ENUM) {
        AddError(field->full_name(), proto,
                 DescriptorPool::ErrorCollector::TYPE,
                 "\"" + proto.type_name() + "\" is not an enum type.");
        return;
      }
      field->enum_type_ = type.enum_descriptor;

      if (field->enum_type()->is_placeholder_) {
        // We can't look up default values for placeholder types.  We'll have
        // to just drop them.
        field->has_default_value_ = false;
      }

      if (field->has_default_value()) {
        // Ensure that the default value is an identifier. Parser cannot always
        // verify this because it does not have complete type information.
        // N.B. that this check yields better error messages but is not
        // necessary for correctness (an enum symbol must be a valid identifier
        // anyway), only for better errors.
        if (!io::Tokenizer::IsIdentifier(proto.default_value())) {
          AddError(field->full_name(), proto,
                   DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                   "Default value for an enum field must be an identifier.");
        } else {
          // We can't just use field->enum_type()->FindValueByName() here
          // because that locks the pool's mutex, which we have already locked
          // at this point.
          Symbol default_value =
            LookupSymbolNoPlaceholder(proto.default_value(),
                                      field->enum_type()->full_name());

          if (default_value.type == Symbol::ENUM_VALUE &&
              default_value.enum_value_descriptor->type() ==
              field->enum_type()) {
            field->default_value_enum_ = default_value.enum_value_descriptor;
          } else {
            AddError(field->full_name(), proto,
                     DescriptorPool::ErrorCollector::DEFAULT_VALUE,
                     "Enum type \"" + field->enum_type()->full_name() +
                     "\" has no value named \"" + proto.default_value() +
                     "\".");
          }
        }
      } else if (field->enum_type()->value_count() > 0) {
        // All enums must have at least one value, or we would have reported
        // an error elsewhere.  We use the first defined value as the default
        // if a default is not explicitly defined.
        field->default_value_enum_ = field->enum_type()->value(0);
      }
    } else {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with primitive type has type_name.");
    }
  } else {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE ||
        field->cpp_type() == FieldDescriptor::CPPTYPE_ENUM) {
      AddError(field->full_name(), proto, DescriptorPool::ErrorCollector::TYPE,
               "Field with message or enum type missing type_name.");
    }
  }

  // Add the field to the fields-by-number table.
  // Note:  We have to do this *after* cross-linking because extensions do not
  // know their containing type until now. If we're in
  // lazily_build_dependencies_ mode, we're guaranteed there's no errors, so no
  // risk to calling containing_type() or other accessors that will build
  // dependencies.
  if (!file_tables_->AddFieldByNumber(field)) {
    const FieldDescriptor* conflicting_field =
      file_tables_->FindFieldByNumber(field->containing_type(),
                                      field->number());
    string containing_type_name = field->containing_type() == NULL
                                      ? "unknown"
                                      : field->containing_type()->full_name();
    if (field->is_extension()) {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("Extension number $0 has already been used "
                                   "in \"$1\" by extension \"$2\".",
                                   field->number(),
                                   containing_type_name,
                                   conflicting_field->full_name()));
    } else {
      AddError(field->full_name(), proto,
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("Field number $0 has already been used in "
                                   "\"$1\" by field \"$2\".",
                                   field->number(),
                                   containing_type_name,
                                   conflicting_field->name()));
    }
  } else {
    if (field->is_extension()) {
      if (!tables_->AddExtension(field)) {
        const FieldDescriptor* conflicting_field =
            tables_->FindExtension(field->containing_type(), field->number());
        string error_msg = strings::Substitute(
            "Extension number $0 has already been used in \"$1\" by extension "
            "\"$2\" defined in $3.",
            field->number(),
            field->containing_type()->full_name(),
            conflicting_field->full_name(),
            conflicting_field->file()->name());
        // Conflicting extension numbers should be an error. However, before
        // turning this into an error we need to fix all existing broken
        // protos first.
        // TODO(xiaofeng): Change this to an error.
        AddWarning(field->full_name(), proto,
                   DescriptorPool::ErrorCollector::NUMBER, error_msg);
      }
    }
  }
}